

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O2

int rtr_send_pdu(rtr_socket *rtr_socket,void *pdu,uint len)

{
  tr_socket *socket;
  undefined8 uVar1;
  time_t timeout;
  long lVar2;
  int iVar3;
  int iVar4;
  ulong __n;
  char *frmt;
  undefined1 *__dest;
  long in_FS_OFFSET;
  time_t tStack_40;
  undefined1 auStack_38 [8];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  __n = (ulong)len;
  lVar2 = -(__n + 0xf & 0xfffffffffffffff0);
  __dest = auStack_38 + lVar2;
  *(undefined8 *)((long)&tStack_40 + lVar2) = 0x10b248;
  memcpy(__dest,pdu,__n);
  *(undefined8 *)((long)&tStack_40 + lVar2) = 0x10b250;
  rtr_pdu_to_network_byte_order(__dest);
  *(undefined8 *)((long)&tStack_40 + lVar2) = 0xffffffffffffffff;
  uVar1 = *(undefined8 *)((long)&tStack_40 + lVar2);
  if (rtr_socket->state != RTR_SHUTDOWN) {
    socket = rtr_socket->tr_socket;
    *(undefined8 *)((long)&tStack_40 + lVar2) = 0x3c;
    timeout = *(time_t *)((long)&tStack_40 + lVar2);
    *(undefined8 *)((long)&tStack_40 + lVar2) = 0x10b26c;
    iVar3 = tr_send_all(socket,__dest,__n,timeout);
    iVar4 = 0;
    if (0 < iVar3) goto LAB_0010b293;
    frmt = "RTR Socket: Error sending PDU";
    if (iVar3 == -2) {
      frmt = "RTR Socket: send would block";
    }
    *(undefined8 *)((long)&tStack_40 + lVar2) = 0x10b290;
    lrtr_dbg(frmt);
  }
  iVar4 = (int)uVar1;
LAB_0010b293:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar4;
  }
  *(code **)((long)&tStack_40 + lVar2) = rtr_send_reset_query;
  __stack_chk_fail();
}

Assistant:

static int rtr_send_pdu(const struct rtr_socket *rtr_socket, const void *pdu, const unsigned int len)
{
	char pdu_converted[len];

	memcpy(pdu_converted, pdu, len);
	rtr_pdu_to_network_byte_order(pdu_converted);
	if (rtr_socket->state == RTR_SHUTDOWN)
		return RTR_ERROR;
	const int rtval = tr_send_all(rtr_socket->tr_socket, pdu_converted, len, RTR_SEND_TIMEOUT);

	if (rtval > 0)
		return RTR_SUCCESS;
	if (rtval == TR_WOULDBLOCK) {
		RTR_DBG1("send would block");
		return RTR_ERROR;
	}

	RTR_DBG1("Error sending PDU");
	return RTR_ERROR;
}